

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O1

void __thiscall
slang::ast::InstanceSymbol::visitExprs<no_implicit_port_name_in_port_connection::MainVisitor&>
          (InstanceSymbol *this,AlwaysFFVisitor *visitor)

{
  Expression *this_00;
  long lVar1;
  span<const_slang::ast::PortConnection_*const,_18446744073709551615UL> sVar2;
  
  sVar2 = getPortConnections(this);
  if (sVar2._M_extent._M_extent_value._M_extent_value != 0) {
    lVar1 = 0;
    do {
      this_00 = PortConnection::getExpression(*(PortConnection **)((long)sVar2._M_ptr + lVar1));
      if (this_00 != (Expression *)0x0) {
        Expression::
        visitExpression<slang::ast::Expression_const,no_implicit_port_name_in_port_connection::MainVisitor&>
                  (this_00,this_00,visitor);
      }
      lVar1 = lVar1 + 8;
    } while (sVar2._M_extent._M_extent_value._M_extent_value << 3 != lVar1);
  }
  return;
}

Assistant:

void InstanceSymbol::visitExprs(TVisitor&& visitor) const {
    for (auto conn : getPortConnections()) {
        if (auto expr = conn->getExpression())
            expr->visit(visitor);
    }
}